

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FSpecialFont::LoadTranslations(FSpecialFont *this)

{
  FTexture *pic;
  long *plVar1;
  BYTE *pBVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  FRemapTable *pFVar6;
  int iVar7;
  ulong uVar8;
  double *luminosity;
  BYTE identity [256];
  BYTE usedcolors [256];
  double *local_240;
  byte local_238 [256];
  BYTE local_138 [264];
  
  iVar3 = (this->super_FFont).FirstChar;
  iVar7 = (this->super_FFont).LastChar;
  memset(local_138,0,0x100);
  iVar7 = iVar7 - iVar3;
  if (-1 < iVar7) {
    uVar8 = (ulong)(iVar7 + 1);
    lVar4 = 0;
    do {
      pic = *(FTexture **)((long)&((this->super_FFont).Chars)->Pic + lVar4);
      if (pic != (FTexture *)0x0) {
        (*pic->_vptr_FTexture[9])(pic);
        pic[1].Scale.X = 0.0;
        RecordTextureColors(pic,local_138);
      }
      lVar4 = lVar4 + 0x10;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  lVar4 = 0;
  do {
    if (this->notranslate[lVar4] == true) {
      local_138[lVar4] = '\0';
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  iVar3 = FFont::SimpleTranslation(local_138,(this->super_FFont).PatchRemap,local_238,&local_240);
  (this->super_FFont).ActiveColors = iVar3;
  lVar4 = 0;
  do {
    if (this->notranslate[lVar4] == true) {
      (this->super_FFont).PatchRemap[lVar4] = (BYTE)iVar3;
      local_238[iVar3] = (byte)lVar4;
      iVar3 = iVar3 + 1;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x100);
  if (-1 < iVar7) {
    uVar8 = (ulong)(iVar7 + 1);
    lVar4 = 0;
    do {
      plVar1 = *(long **)((long)&((this->super_FFont).Chars)->Pic + lVar4);
      if (plVar1 != (long *)0x0) {
        pBVar2 = (this->super_FFont).PatchRemap;
        (**(code **)(*plVar1 + 0x48))(plVar1);
        plVar1[0xd] = (long)pBVar2;
      }
      lVar4 = lVar4 + 0x10;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
  }
  FFont::BuildTranslations
            (&this->super_FFont,local_240,local_238,TranslationParms[0].Array,iVar3,(PalEntry *)0x0)
  ;
  if (((this->super_FFont).ActiveColors < iVar3) && (0 < NumTextColors)) {
    lVar4 = 0;
    do {
      iVar7 = (this->super_FFont).ActiveColors;
      lVar5 = (long)iVar7;
      if (iVar7 < iVar3) {
        pFVar6 = (this->super_FFont).Ranges.Array + lVar4;
        do {
          pFVar6->Remap[lVar5] = local_238[lVar5];
          pFVar6->Palette[lVar5].field_0 = GPalette.BaseColors[local_238[lVar5]].field_0;
          pFVar6->Palette[lVar5].field_0.field_0.a = 0xff;
          lVar5 = lVar5 + 1;
        } while (iVar3 != lVar5);
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < NumTextColors);
  }
  (this->super_FFont).ActiveColors = iVar3;
  if (local_240 != (double *)0x0) {
    operator_delete__(local_240);
  }
  return;
}

Assistant:

void FSpecialFont::LoadTranslations()
{
	int count = LastChar - FirstChar + 1;
	BYTE usedcolors[256], identity[256];
	double *luminosity;
	int TotalColors;
	int i, j;

	memset (usedcolors, 0, 256);
	for (i = 0; i < count; i++)
	{
		FFontChar1 *pic = static_cast<FFontChar1 *>(Chars[i].Pic);
		if(pic)
		{
			pic->SetSourceRemap(NULL); // Force the FFontChar1 to return the same pixels as the base texture
			RecordTextureColors (pic, usedcolors);
		}
	}

	// exclude the non-translated colors from the translation calculation
	for (i = 0; i < 256; i++)
		if (notranslate[i])
			usedcolors[i] = false;

	TotalColors = ActiveColors = SimpleTranslation (usedcolors, PatchRemap, identity, &luminosity);

	// Map all untranslated colors into the table of used colors
	for (i = 0; i < 256; i++) 
	{
		if (notranslate[i])
		{
			PatchRemap[i] = TotalColors;
			identity[TotalColors] = i;
			TotalColors++;
		}
	}

	for (i = 0; i < count; i++)
	{
		if(Chars[i].Pic)
			static_cast<FFontChar1 *>(Chars[i].Pic)->SetSourceRemap(PatchRemap);
	}

	BuildTranslations (luminosity, identity, &TranslationParms[0][0], TotalColors, NULL);

	// add the untranslated colors to the Ranges tables
	if (ActiveColors < TotalColors)
	{
		for (i = 0; i < NumTextColors; i++)
		{
			FRemapTable *remap = &Ranges[i];
			for (j = ActiveColors; j < TotalColors; ++j)
			{
				remap->Remap[j] = identity[j];
				remap->Palette[j] = GPalette.BaseColors[identity[j]];
				remap->Palette[j].a = 0xff;
			}
		}
	}
	ActiveColors = TotalColors;

	delete[] luminosity;
}